

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::PrepareFramebufferMultisample<2u>
          (StorageMultisampleTest *this,GLenum internal_format)

{
  code *pcVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar9;
  undefined4 *puVar10;
  Enum<int,_2UL> EVar11;
  Enum<int,_2UL> local_1f0;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLenum error;
  Functions *gl;
  StorageMultisampleTest *pSStack_18;
  GLenum internal_format_local;
  StorageMultisampleTest *this_local;
  
  gl._4_4_ = internal_format;
  pSStack_18 = this;
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar8->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lStack_28 + 0x6d0))(1,&this->m_fbo_ms);
  dVar4 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xdd1);
  (**(code **)(lStack_28 + 0x6f8))(1,&this->m_to_ms);
  dVar4 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar4,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xdd4);
  (**(code **)(lStack_28 + 0x78))(0x8d40,this->m_fbo_ms);
  dVar4 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xdd7);
  (**(code **)(lStack_28 + 0xb8))(0x9100,this->m_to_ms);
  dVar4 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar4,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xdda);
  GVar2 = gl._4_4_;
  pcVar1 = *(code **)(lStack_28 + 0x1460);
  GVar7 = this->m_to_ms;
  GVar5 = TestReferenceDataWidth<2u>();
  GVar6 = TestReferenceDataHeight<2u>();
  (*pcVar1)(GVar7,1,GVar2,GVar5,GVar6,0);
  local_2c = (**(code **)(lStack_28 + 0x800))();
  if (local_2c == 0) {
    (**(code **)(lStack_28 + 0x6a0))(0x8d40,0x8ce0,0x9100,this->m_to_ms,0);
    dVar4 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar4,"glFramebufferRenderbuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xdee);
    iVar3 = (**(code **)(lStack_28 + 0x170))(0x8d40);
    if (iVar3 != 0x8cd5) {
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    pcVar1 = *(code **)(lStack_28 + 0x1a00);
    GVar7 = TestReferenceDataWidth<2u>();
    GVar5 = TestReferenceDataHeight<2u>();
    (*pcVar1)(0,0,GVar7,GVar5);
    dVar4 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar4,"glViewport call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xdf6);
    (**(code **)(lStack_28 + 0x1c0))(0,0,0);
    dVar4 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar4,"glClearColor call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xdfa);
    (**(code **)(lStack_28 + 0x188))(0x4000);
    dVar4 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar4,"glClear call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xdfd);
    this_local._7_1_ = true;
  }
  else {
    CleanFramebuffers(this);
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [60])"glTextureStorage2DMultisample unexpectedly generated error "
                       );
    EVar11 = glu::getErrorStr(local_2c);
    local_1e0 = EVar11.m_getName;
    local_1d8 = EVar11.m_value;
    local_1d0[0].m_getName = local_1e0;
    local_1d0[0].m_value = local_1d8;
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_1d0);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [37])" during the test of internal format ");
    EVar11 = glu::getTextureFormatStr(gl._4_4_);
    local_1f0.m_getName = EVar11.m_getName;
    local_1f0.m_value = EVar11.m_value;
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1f0);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])0x2a850ac);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StorageMultisampleTest::PrepareFramebufferMultisample<2>(const glw::GLenum internal_format)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare framebuffer. */
	gl.genFramebuffers(1, &m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genTextures(1, &m_to_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_to_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.textureStorage2DMultisample(m_to_ms, 1, internal_format, TestReferenceDataWidth<2>(),
								   TestReferenceDataHeight<2>(), false);

	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		CleanFramebuffers();

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTextureStorage2DMultisample unexpectedly generated error "
			<< glu::getErrorStr(error) << " during the test of internal format "
			<< glu::getTextureFormatStr(internal_format) << ". Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, m_to_ms, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, TestReferenceDataWidth<2>(), TestReferenceDataHeight<2>());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	/* Clear framebuffer's content. */
	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");

	return true;
}